

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::SGXMLScanner::laxElementValidation
          (SGXMLScanner *this,QName *element,ContentLeafNameTypeVector *cv,XMLContentModel *cm,
          XMLSize_t parentElemDepth)

{
  XMLCh XVar1;
  XMLCh XVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  NodeTypes NVar7;
  uint uVar8;
  XMLSize_t XVar9;
  QName *exemplar;
  XMLCh *pXVar10;
  XMLCh *pXVar11;
  uint uVar12;
  XMLSize_t pos;
  XMLSize_t pos_00;
  bool bVar13;
  SubstitutionGroupComparator comparator;
  uint local_70;
  SubstitutionGroupComparator local_40;
  
  uVar12 = this->fElemState[parentElemDepth];
  local_70 = 0xffffffff;
  if (uVar12 == 0xffffffff) {
LAB_002b9932:
    bVar6 = false;
  }
  else {
    uVar3 = element->fURIId;
    uVar4 = this->fElemLoopState[parentElemDepth];
    local_40.fGrammarResolver = (this->super_XMLScanner).fGrammarResolver;
    local_40.fStringPool = (this->super_XMLScanner).fURIStringPool;
    uVar8 = 0;
    if (cv == (ContentLeafNameTypeVector *)0x0) {
      bVar6 = false;
      bVar13 = false;
    }
    else {
      XVar9 = ContentLeafNameTypeVector::getLeafCount(cv);
      if (XVar9 == 0) {
        pos_00 = 0;
      }
      else {
        uVar8 = 0;
        pos = 0;
        do {
          exemplar = ContentLeafNameTypeVector::getLeafNameAt(cv,pos);
          uVar5 = exemplar->fURIId;
          NVar7 = ContentLeafNameTypeVector::getLeafTypeAt(cv,pos);
          if (NVar7 == Leaf) {
            if (uVar5 == uVar3) {
              pXVar11 = exemplar->fLocalPart;
              pXVar10 = element->fLocalPart;
              if (pXVar11 == pXVar10) goto LAB_002b986a;
              if (pXVar10 != (XMLCh *)0x0 && pXVar11 != (XMLCh *)0x0) {
                do {
                  XVar1 = *pXVar11;
                  if (XVar1 == L'\0') goto LAB_002b9849;
                  pXVar11 = pXVar11 + 1;
                  XVar2 = *pXVar10;
                  pXVar10 = pXVar10 + 1;
                } while (XVar1 == XVar2);
                goto LAB_002b9854;
              }
              if (pXVar11 == (XMLCh *)0x0) {
                if (pXVar10 == (XMLCh *)0x0) goto LAB_002b986a;
LAB_002b9849:
                bVar13 = *pXVar10 == L'\0';
              }
              else {
                bVar13 = *pXVar11 == L'\0';
                if ((pXVar10 != (XMLCh *)0x0) && (*pXVar11 == L'\0')) goto LAB_002b9849;
              }
              if (!bVar13) goto LAB_002b9854;
            }
            else {
LAB_002b9854:
              bVar13 = SubstitutionGroupComparator::isEquivalentTo(&local_40,element,exemplar);
              if (!bVar13) goto LAB_002b9882;
            }
LAB_002b986a:
            uVar8 = (*cm->_vptr_XMLContentModel[6])(cm,(ulong)uVar12,pos);
            if (uVar8 == 0xffffffff) goto LAB_002b9882;
            bVar13 = false;
          }
          else {
            NVar7 = NVar7 & (Any_NS|Any_Other);
            if (NVar7 == Any_NS) {
              if (uVar5 == uVar3) goto LAB_002b986a;
            }
            else if (NVar7 == Any_Other) {
              if ((uVar5 != uVar3) && (uVar3 != (this->super_XMLScanner).fEmptyNamespaceId))
              goto LAB_002b986a;
            }
            else if (NVar7 == Any) goto LAB_002b986a;
LAB_002b9882:
            bVar13 = true;
          }
          pos_00 = pos;
        } while ((bVar13) && (pos = pos + 1, pos_00 = XVar9, pos != XVar9));
      }
      bVar6 = false;
      bVar13 = false;
      uVar12 = 0;
      if (pos_00 != XVar9) {
        NVar7 = ContentLeafNameTypeVector::getLeafTypeAt(cv,pos_00);
        uVar12 = uVar4;
        local_70 = uVar8;
        if ((uint)((NVar7 & (Any_NS|Any_Other)) + ~Sequence) < 3) {
          bVar13 = 2 < (uint)(NVar7 + ~(ModelGroupChoice|ZeroOrOne));
          bVar6 = bVar13 && (uint)(NVar7 + ~ModelGroupSequence) < 3;
          bVar13 = !bVar13;
        }
        else {
          bVar6 = false;
          bVar13 = false;
        }
      }
      this->fElemState[parentElemDepth] = local_70;
      this->fElemLoopState[parentElemDepth] = uVar12;
      if (pos_00 == XVar9) goto LAB_002b9932;
    }
    if (bVar13) {
      (this->super_XMLScanner).fValidate = false;
      (this->super_XMLScanner).fElemStack.fStack[(this->super_XMLScanner).fElemStack.fStackTop - 1]
      ->fValidationFlag = false;
    }
  }
  return bVar6;
}

Assistant:

bool SGXMLScanner::laxElementValidation(QName* element, ContentLeafNameTypeVector* cv,
                                        const XMLContentModel* const cm,
                                        const XMLSize_t parentElemDepth)
{
    bool skipThisOne = false;
    bool laxThisOne = false;
    unsigned int elementURI = element->getURI();
    unsigned int currState = fElemState[parentElemDepth];
    unsigned int currLoop = fElemLoopState[parentElemDepth];

    if (currState == XMLContentModel::gInvalidTrans) {
        return laxThisOne;
    }

    SubstitutionGroupComparator comparator(fGrammarResolver, fURIStringPool);

    if (cv) {
        XMLSize_t i = 0;
        XMLSize_t leafCount = cv->getLeafCount();
        unsigned int nextState = 0;

        for (; i < leafCount; i++) {

            QName* fElemMap = cv->getLeafNameAt(i);
            unsigned int uri = fElemMap->getURI();
            ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);

            if (type == ContentSpecNode::Leaf) {
                if (((uri == elementURI)
                      && XMLString::equals(fElemMap->getLocalPart(), element->getLocalPart()))
                    || comparator.isEquivalentTo(element, fElemMap)) {

                    nextState = cm->getNextState(currState, i);

                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            } else if ((type & 0x0f) == ContentSpecNode::Any) {
                nextState = cm->getNextState(currState, i);
                if (nextState != XMLContentModel::gInvalidTrans)
                    break;
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_Other) {
                if (uri != elementURI && elementURI != fEmptyNamespaceId) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else if ((type & 0x0f) == ContentSpecNode::Any_NS) {
                if (uri == elementURI) {
                    nextState = cm->getNextState(currState, i);
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }

        } // for

        if (i == leafCount) { // no match
            fElemState[parentElemDepth] = XMLContentModel::gInvalidTrans;
            fElemLoopState[parentElemDepth] = 0;
            return laxThisOne;
        }

        ContentSpecNode::NodeTypes type = cv->getLeafTypeAt(i);
        if ((type & 0x0f) == ContentSpecNode::Any ||
            (type & 0x0f) == ContentSpecNode::Any_Other ||
            (type & 0x0f) == ContentSpecNode::Any_NS)
        {
            if (type == ContentSpecNode::Any_Skip ||
                type == ContentSpecNode::Any_NS_Skip ||
                type == ContentSpecNode::Any_Other_Skip) {
                skipThisOne = true;
            }
            else if (type == ContentSpecNode::Any_Lax ||
                     type == ContentSpecNode::Any_NS_Lax ||
                     type == ContentSpecNode::Any_Other_Lax) {
                laxThisOne = true;
            }
        }
        fElemState[parentElemDepth] = nextState;
        fElemLoopState[parentElemDepth] = currLoop;
    } // if

    if (skipThisOne) {
        fValidate = false;
        fElemStack.setValidationFlag(fValidate);
    }

    return laxThisOne;
}